

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::CalcWindowNextAutoFitSize(ImGuiWindow *window)

{
  ImVec2 IVar1;
  ImGuiWindow *in_RDI;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  ImVec2 size_auto_fit;
  ImVec2 size_contents_ideal;
  ImVec2 size_contents_current;
  ImVec2 size_final;
  ImVec2 *in_stack_00000070;
  ImGuiWindow *in_stack_00000078;
  ImVec2 in_stack_ffffffffffffffe0;
  ImVec2 in_stack_ffffffffffffffe8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe8);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffe0);
  CalcWindowContentSizes
            (in_RDI,(ImVec2 *)in_stack_ffffffffffffffe8,(ImVec2 *)in_stack_ffffffffffffffe0);
  auVar2._0_8_ = CalcWindowAutoFitSize(in_stack_00000078,in_stack_00000070);
  auVar2._8_56_ = extraout_var;
  vmovlpd_avx(auVar2._0_16_);
  auVar3._0_8_ = CalcWindowSizeAfterConstraint(window,(ImVec2 *)size_contents_current);
  auVar3._8_56_ = extraout_var_00;
  IVar1 = (ImVec2)vmovlpd_avx(auVar3._0_16_);
  return IVar1;
}

Assistant:

ImVec2 ImGui::CalcWindowNextAutoFitSize(ImGuiWindow* window)
{
    ImVec2 size_contents_current;
    ImVec2 size_contents_ideal;
    CalcWindowContentSizes(window, &size_contents_current, &size_contents_ideal);
    ImVec2 size_auto_fit = CalcWindowAutoFitSize(window, size_contents_ideal);
    ImVec2 size_final = CalcWindowSizeAfterConstraint(window, size_auto_fit);
    return size_final;
}